

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O2

void av1_tpl_rdmult_setup(AV1_COMP *cpi)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  TplDepFrame *pTVar5;
  TplDepStats *pTVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int mi_row;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  double dVar18;
  double mc_dep_cost;
  double dVar19;
  double dVar20;
  
  bVar1 = cpi->gf_frame_index;
  pTVar5 = (cpi->ppi->tpl_data).tpl_frame;
  if (pTVar5[bVar1].is_valid != '\0') {
    pTVar6 = pTVar5[bVar1].tpl_stats_ptr;
    iVar3 = pTVar5[bVar1].stride;
    iVar4 = (cpi->common).mi_params.mi_rows;
    uVar16 = (cpi->common).superres_upscaled_width + 7 >> 2 & 0xfffffffe;
    uVar11 = (int)(uVar16 + 3) / 4;
    uVar15 = (long)(iVar4 + 3) / 4;
    bVar2 = (cpi->ppi->tpl_data).tpl_stats_block_mis_log2;
    iVar9 = 1 << (bVar2 & 0x1f);
    uVar14 = 0;
    if (0 < (int)uVar11) {
      uVar14 = (ulong)uVar11;
    }
    uVar12 = 0;
    uVar7 = uVar15 & 0xffffffff;
    if ((int)uVar15 < 1) {
      uVar7 = uVar12;
    }
    for (; uVar12 != uVar7; uVar12 = uVar12 + 1) {
      lVar8 = 0;
      for (uVar15 = 0; uVar15 != uVar14; uVar15 = uVar15 + 1) {
        dVar19 = 0.0;
        dVar18 = 0.0;
        for (iVar10 = (int)uVar12 * 4; iVar10 < (int)uVar12 * 4 + 4; iVar10 = iVar10 + iVar9) {
          for (lVar17 = lVar8; lVar17 < (long)(uVar15 * 4 + 4); lVar17 = lVar17 + iVar9) {
            if ((iVar10 < iVar4) && ((int)lVar17 < (int)uVar16)) {
              iVar13 = ((int)lVar17 >> (bVar2 & 0x1f)) + (iVar10 >> (bVar2 & 0x1f)) * iVar3;
              dVar20 = (double)(pTVar6[iVar13].recrf_dist << 7);
              dVar18 = dVar18 + dVar20;
              dVar19 = dVar19 + (double)(pTVar6[iVar13].mc_dep_dist * 0x80 +
                                        ((long)pTVar5[bVar1].base_rdmult *
                                         pTVar6[iVar13].mc_dep_rate + 0x100 >> 9)) + dVar20;
            }
          }
        }
        cpi->tpl_rdmult_scaling_factors[uVar15 + uVar12 * (long)(int)uVar11] =
             (dVar18 / dVar19) / (cpi->rd).r0 + 1.2;
        lVar8 = lVar8 + 4;
      }
    }
  }
  return;
}

Assistant:

void av1_tpl_rdmult_setup(AV1_COMP *cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  const int tpl_idx = cpi->gf_frame_index;

  assert(
      IMPLIES(cpi->ppi->gf_group.size > 0, tpl_idx < cpi->ppi->gf_group.size));

  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  const TplDepFrame *const tpl_frame = &tpl_data->tpl_frame[tpl_idx];

  if (!tpl_frame->is_valid) return;

  const TplDepStats *const tpl_stats = tpl_frame->tpl_stats_ptr;
  const int tpl_stride = tpl_frame->stride;
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);

  const int block_size = BLOCK_16X16;
  const int num_mi_w = mi_size_wide[block_size];
  const int num_mi_h = mi_size_high[block_size];
  const int num_cols = (mi_cols_sr + num_mi_w - 1) / num_mi_w;
  const int num_rows = (cm->mi_params.mi_rows + num_mi_h - 1) / num_mi_h;
  const double c = 1.2;
  const int step = 1 << tpl_data->tpl_stats_block_mis_log2;

  // Loop through each 'block_size' X 'block_size' block.
  for (int row = 0; row < num_rows; row++) {
    for (int col = 0; col < num_cols; col++) {
      double intra_cost = 0.0, mc_dep_cost = 0.0;
      // Loop through each mi block.
      for (int mi_row = row * num_mi_h; mi_row < (row + 1) * num_mi_h;
           mi_row += step) {
        for (int mi_col = col * num_mi_w; mi_col < (col + 1) * num_mi_w;
             mi_col += step) {
          if (mi_row >= cm->mi_params.mi_rows || mi_col >= mi_cols_sr) continue;
          const TplDepStats *this_stats = &tpl_stats[av1_tpl_ptr_pos(
              mi_row, mi_col, tpl_stride, tpl_data->tpl_stats_block_mis_log2)];
          int64_t mc_dep_delta =
              RDCOST(tpl_frame->base_rdmult, this_stats->mc_dep_rate,
                     this_stats->mc_dep_dist);
          intra_cost += (double)(this_stats->recrf_dist << RDDIV_BITS);
          mc_dep_cost +=
              (double)(this_stats->recrf_dist << RDDIV_BITS) + mc_dep_delta;
        }
      }
      const double rk = intra_cost / mc_dep_cost;
      const int index = row * num_cols + col;
      cpi->tpl_rdmult_scaling_factors[index] = rk / cpi->rd.r0 + c;
    }
  }
}